

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *o,Vector<double,_3U> *v)

{
  double *pdVar1;
  Vector<double,_3U> *in_RSI;
  ostream *in_RDI;
  uint i;
  uint local_14;
  
  std::operator<<(in_RDI,"[ ");
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    pdVar1 = Vector<double,_3U>::operator[](in_RSI,local_14);
    std::ostream::operator<<(in_RDI,*pdVar1);
    if (local_14 != 2) {
      std::operator<<(in_RDI,", ");
    }
  }
  std::operator<<(in_RDI," ]");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const Vector<Real, Dim>& v) {
    o << "[ ";

    for (unsigned int i = 0; i < Dim; i++) {
      o << v[i];

      if (i != Dim - 1) { o << ", "; }
    }

    o << " ]";
    return o;
  }